

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_socket.c
# Opt level: O0

ssize_t do_poll(amqp_connection_state_t state,ssize_t res,amqp_time_t deadline)

{
  int iVar1;
  long in_RSI;
  amqp_time_t in_RDI;
  int fd;
  amqp_connection_state_t in_stack_ffffffffffffffd0;
  undefined8 local_8;
  
  iVar1 = amqp_get_sockfd(in_stack_ffffffffffffffd0);
  if (iVar1 == -1) {
    local_8 = -0x11;
  }
  else {
    iVar1 = (int)((ulong)in_RSI >> 0x20);
    if (in_RSI == -0x1302) {
      iVar1 = amqp_poll(iVar1,(int)in_RSI,in_RDI);
      local_8 = (long)iVar1;
    }
    else {
      local_8 = in_RSI;
      if (in_RSI == -0x1301) {
        iVar1 = amqp_poll(iVar1,(int)in_RSI,in_RDI);
        local_8 = (long)iVar1;
      }
    }
  }
  return local_8;
}

Assistant:

static ssize_t do_poll(amqp_connection_state_t state, ssize_t res,
                       amqp_time_t deadline) {
  int fd = amqp_get_sockfd(state);
  if (-1 == fd) {
    return AMQP_STATUS_SOCKET_CLOSED;
  }
  switch (res) {
    case AMQP_PRIVATE_STATUS_SOCKET_NEEDREAD:
      res = amqp_poll(fd, AMQP_SF_POLLIN, deadline);
      break;
    case AMQP_PRIVATE_STATUS_SOCKET_NEEDWRITE:
      res = amqp_poll(fd, AMQP_SF_POLLOUT, deadline);
      break;
  }
  return res;
}